

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O0

wstring * cfgfile::
          format_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_cfgfile::qstring_trait_t>
          ::from_string(parser_info_t<cfgfile::qstring_trait_t> *param_1,string_t *value)

{
  QString *in_RDX;
  wstring *in_RDI;
  
  qstring_wrapper_t::operator_cast_to_QString((qstring_wrapper_t *)in_RDI);
  QString::toStdWString_abi_cxx11_(in_RDX);
  QString::~QString((QString *)0x147f6e);
  return in_RDI;
}

Assistant:

static std::wstring from_string( const parser_info_t< qstring_trait_t > &,
		const qstring_trait_t::string_t & value )
	{
		return ((QString)value).toStdWString();
	}